

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

int http_snprintf(nng_http *conn,char *buf,size_t sz)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 *item;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  nng_http_status nVar10;
  char *__s;
  nni_list *list;
  bool bVar11;
  
  if (conn->client == true) {
    pcVar7 = conn->uri;
    if (pcVar7 == (char *)0x0) {
      pcVar3 = "/";
    }
    else {
      pcVar3 = "/";
      if (*pcVar7 != '\0') {
        pcVar3 = pcVar7;
      }
    }
    iVar1 = snprintf(buf,sz,"%s %s %s\r\n",conn->meth,pcVar3,conn->vers);
    lVar6 = 0x500;
  }
  else {
    pcVar7 = conn->vers;
    nVar10 = NNG_HTTP_STATUS_OK;
    if (conn->code != 0) {
      nVar10 = conn->code;
    }
    pcVar3 = nni_http_get_reason(conn);
    iVar1 = snprintf(buf,sz,"%s %d %s\r\n",pcVar7,(ulong)nVar10,pcVar3);
    lVar6 = 0x628;
  }
  list = (nni_list *)((long)&conn->sock + lVar6);
  uVar4 = (ulong)iVar1;
  pcVar7 = (char *)(sz - uVar4);
  if (sz < uVar4) {
    pcVar7 = (char *)0x0;
  }
  pcVar3 = buf + uVar4;
  if (sz < uVar4 || (char *)(sz - uVar4) == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  pcVar9 = pcVar7;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  item = (undefined8 *)nni_list_first(list);
  pcVar8 = (char *)0x0;
  __s = pcVar3;
  for (; item != (undefined8 *)0x0; item = (undefined8 *)nni_list_next(list,item)) {
    iVar2 = snprintf(__s,(size_t)pcVar9,"%s: %s\r\n",*item,item[1]);
    pcVar5 = (char *)(long)iVar2;
    if (__s != (char *)0x0) {
      __s = __s + (long)pcVar5;
    }
    bVar11 = pcVar9 < pcVar5;
    pcVar9 = pcVar9 + -(long)pcVar5;
    if (bVar11) {
      pcVar9 = (char *)0x0;
    }
    pcVar8 = pcVar8 + (long)pcVar5;
  }
  pcVar9 = pcVar7 + -(long)pcVar8;
  if (pcVar7 < pcVar8) {
    pcVar9 = (char *)0x0;
  }
  pcVar3 = pcVar3 + (long)pcVar8;
  if (pcVar7 < pcVar8 || pcVar7 + -(long)pcVar8 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  iVar2 = snprintf(pcVar3,(size_t)pcVar9,"\r\n");
  return iVar2 + iVar1 + (int)pcVar8;
}

Assistant:

static int
http_snprintf(nng_http *conn, char *buf, size_t sz)
{
	size_t    len;
	size_t    n;
	nni_list *hdrs;

	if (conn->client) {
		len  = snprintf(buf, sz, "%s %s %s\r\n",
		     nni_http_get_method(conn), nni_http_get_uri(conn),
		     nni_http_get_version(conn));
		hdrs = &conn->req.data.hdrs;
	} else {
		len  = snprintf(buf, sz, "%s %d %s\r\n",
		     nni_http_get_version(conn), nni_http_get_status(conn),
		     nni_http_get_reason(conn));
		hdrs = &conn->res.data.hdrs;
	}

	if (len < sz) {
		sz -= len;
		buf += len;
	} else {
		sz  = 0;
		buf = NULL;
	}

	n = http_sprintf_headers(buf, sz, hdrs);
	len += n;
	if (n < sz) {
		sz -= n;
		buf += n;
	} else {
		sz  = 0;
		buf = NULL;
	}

	len += snprintf(buf, sz, "\r\n");
	return (len);
}